

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

char * c4::yml::NodeType::type_str(NodeType_e ty)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = (uint)ty;
  switch(uVar2 & 0xfff) {
  case 0:
    return "NOTYPE";
  case 1:
    return "VAL";
  case 2:
    return "KEY";
  case 3:
    return "KEYVAL";
  case 4:
    return "MAP";
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
    goto switchD_001f8575_caseD_5;
  case 6:
    return "KEYMAP";
  case 8:
    return "SEQ";
  case 10:
    return "KEYSEQ";
  case 0x10:
    return "DOC";
  case 0x11:
    return "DOCVAL";
  case 0x14:
    return "DOCMAP";
  case 0x18:
    return "DOCSEQ";
  }
  if ((uVar2 & 0xfff) == 0x28) {
    return "STREAM";
  }
switchD_001f8575_caseD_5:
  if ((~uVar2 & 3) == 0) {
    return "KEYVAL***";
  }
  if ((~uVar2 & 6) == 0) {
    return "KEYMAP***";
  }
  if ((~uVar2 & 10) == 0) {
    return "KEYSEQ***";
  }
  if ((~uVar2 & 0x18) == 0) {
    return "DOCSEQ***";
  }
  if ((~uVar2 & 0x14) == 0) {
    return "DOCMAP***";
  }
  if ((~uVar2 & 0x11) == 0) {
    return "DOCVAL***";
  }
  if ((ty & KEY) != NOTYPE) {
    return "KEY***";
  }
  if ((ty & VAL) != NOTYPE) {
    return "VAL***";
  }
  if ((ty & MAP) != NOTYPE) {
    return "MAP***";
  }
  if ((ty & SEQ) != NOTYPE) {
    return "SEQ***";
  }
  pcVar1 = "DOC***";
  if ((ty & DOC) == NOTYPE) {
    pcVar1 = "(unk)";
  }
  return pcVar1;
}

Assistant:

const char* NodeType::type_str(NodeType_e ty)
{
    switch(ty & _TYMASK)
    {
    case KEYVAL:
        return "KEYVAL";
    case KEY:
        return "KEY";
    case VAL:
        return "VAL";
    case MAP:
        return "MAP";
    case SEQ:
        return "SEQ";
    case KEYMAP:
        return "KEYMAP";
    case KEYSEQ:
        return "KEYSEQ";
    case DOCSEQ:
        return "DOCSEQ";
    case DOCMAP:
        return "DOCMAP";
    case DOCVAL:
        return "DOCVAL";
    case DOC:
        return "DOC";
    case STREAM:
        return "STREAM";
    case NOTYPE:
        return "NOTYPE";
    default:
        if((ty & KEYVAL) == KEYVAL)
            return "KEYVAL***";
        if((ty & KEYMAP) == KEYMAP)
            return "KEYMAP***";
        if((ty & KEYSEQ) == KEYSEQ)
            return "KEYSEQ***";
        if((ty & DOCSEQ) == DOCSEQ)
            return "DOCSEQ***";
        if((ty & DOCMAP) == DOCMAP)
            return "DOCMAP***";
        if((ty & DOCVAL) == DOCVAL)
            return "DOCVAL***";
        if(ty & KEY)
            return "KEY***";
        if(ty & VAL)
            return "VAL***";
        if(ty & MAP)
            return "MAP***";
        if(ty & SEQ)
            return "SEQ***";
        if(ty & DOC)
            return "DOC***";
        return "(unk)";
    }
}